

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<std::pair<QByteArray,_QByteArray>_>::reserve
          (QList<std::pair<QByteArray,_QByteArray>_> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  uint uVar2;
  Data *pDVar3;
  pair<QByteArray,_QByteArray> *ppVar4;
  long lVar5;
  pair<QByteArray,_QByteArray> *this_00;
  pair<QByteArray,_QByteArray> *ppVar6;
  pair<QByteArray,_QByteArray> *ppVar7;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->d).d;
  if ((pDVar3 != (Data *)0x0) &&
     (asize <= ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 4) * 0x5555555555555555 + (pDVar3->super_QArrayData).alloc)) {
    uVar2 = (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
            super_QFlagsStorage<QArrayData::ArrayOption>.i;
    if ((uVar2 & 1) != 0) goto LAB_001726fc;
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1) {
      (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = uVar2 | 1;
      goto LAB_001726fc;
    }
  }
  lVar5 = (this->d).size;
  if (asize < lVar5) {
    asize = lVar5;
  }
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  ppVar4 = (pair<QByteArray,_QByteArray> *)
           QArrayData::allocate((QArrayData **)&local_58,0x30,0x10,asize,KeepSize);
  pDVar3 = local_58.d;
  lVar5 = (this->d).size;
  if (lVar5 < 1) {
    lVar5 = 0;
  }
  else {
    ppVar7 = (this->d).ptr;
    ppVar6 = ppVar7 + lVar5;
    lVar5 = 0;
    this_00 = ppVar4;
    do {
      std::pair<QByteArray,_QByteArray>::pair(this_00,ppVar7);
      ppVar7 = ppVar7 + 1;
      lVar5 = lVar5 + 1;
      this_00 = this_00 + 1;
    } while (ppVar7 < ppVar6);
  }
  if (pDVar3 != (Data *)0x0) {
    pAVar1 = &(pDVar3->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  local_58.d = (this->d).d;
  local_58.ptr = (this->d).ptr;
  (this->d).d = pDVar3;
  (this->d).ptr = ppVar4;
  local_58.size = (this->d).size;
  (this->d).size = lVar5;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::~QArrayDataPointer(&local_58);
LAB_001726fc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}